

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_ext_path(lyd_node *parent,lysc_ext_instance *ext,char *path,void *value,
                       uint32_t options,lyd_node **node)

{
  LY_ERR LVar1;
  ly_ctx *ctx;
  char *pcVar2;
  ly_ctx *ctx_00;
  
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar2 = "ext";
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = ext->module->ctx;
    if (path == (char *)0x0) {
      pcVar2 = "path";
    }
    else if ((parent == (lyd_node *)0x0) && (*path != '/')) {
      pcVar2 = "(path[0] == \'/\') || parent";
    }
    else {
      if ((~options & 0xc) != 0) {
        if (parent != (lyd_node *)0x0) {
          if (parent->schema == (lysc_node *)0x0) {
            ctx_00 = (ly_ctx *)parent[2].schema;
          }
          else {
            ctx_00 = parent->schema->module->ctx;
          }
          if (((ctx_00 != (ly_ctx *)0x0) && (ctx != (ly_ctx *)0x0)) && (ctx_00 != ctx)) {
            ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
        LVar1 = lyd_new_path_(parent,ctx,ext,path,value,0,LYD_ANYDATA_STRING,options,node,
                              (lyd_node **)0x0);
        return LVar1;
      }
      pcVar2 = "!(options & 0x04) || !(options & 0x08)";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lyd_new_ext_path");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_path(struct lyd_node *parent, const struct lysc_ext_instance *ext, const char *path, const void *value,
        uint32_t options, struct lyd_node **node)
{
    const struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;

    LY_CHECK_ARG_RET(ctx, ext, path, (path[0] == '/') || parent,
            !(options & LYD_NEW_VAL_BIN) || !(options & LYD_NEW_VAL_CANON), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, ctx, LY_EINVAL);

    return lyd_new_path_(parent, ctx, ext, path, value, 0, LYD_ANYDATA_STRING, options, node, NULL);
}